

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_join.cpp
# Opt level: O1

bool __thiscall duckdb::PhysicalJoin::EmptyResultIfRHSIsEmpty(PhysicalJoin *this)

{
  byte bVar1;
  
  bVar1 = (this->super_CachingPhysicalOperator).field_0x81;
  return (bool)((byte)(0x62c >> (bVar1 & 0x1f)) & bVar1 < 0xb);
}

Assistant:

bool PhysicalJoin::EmptyResultIfRHSIsEmpty() const {
	// empty RHS with INNER, RIGHT or SEMI join means empty result set
	switch (join_type) {
	case JoinType::INNER:
	case JoinType::RIGHT:
	case JoinType::SEMI:
	case JoinType::RIGHT_SEMI:
	case JoinType::RIGHT_ANTI:
		return true;
	default:
		return false;
	}
}